

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void check_stat(Emulator *e)

{
  u8 *puVar1;
  PPUMode PVar2;
  Bool BVar3;
  
  PVar2 = (e->state).ppu.stat.trigger_mode;
  if ((e->state).ppu.stat.if_ == FALSE) {
    if (PVar2 == PPU_MODE_VBLANK) {
      if ((e->state).ppu.stat.vblank.irq == FALSE) goto LAB_0010c247;
      puVar1 = &(e->state).interrupt.new_if;
      *puVar1 = *puVar1 | 2;
    }
    else {
      if ((PVar2 == PPU_MODE_HBLANK) && ((e->state).ppu.stat.hblank.irq != FALSE)) {
        puVar1 = &(e->state).interrupt.new_if;
        *puVar1 = *puVar1 | 2;
      }
      else {
LAB_0010c247:
        if ((((e->state).ppu.stat.mode2.trigger == FALSE) ||
            ((e->state).ppu.stat.mode2.irq == FALSE)) &&
           (((e->state).ppu.stat.y_compare.trigger == FALSE ||
            ((e->state).ppu.stat.y_compare.irq == FALSE)))) goto LAB_0010c1d1;
        puVar1 = &(e->state).interrupt.new_if;
        *puVar1 = *puVar1 | 2;
        if ((PVar2 == PPU_MODE_VBLANK) && (BVar3 = TRUE, (e->state).ppu.stat.vblank.irq != FALSE))
        goto LAB_0010c2b0;
      }
      if (((e->state).ppu.stat.y_compare.trigger != FALSE) &&
         (BVar3 = TRUE, (e->state).ppu.stat.y_compare.irq != FALSE)) goto LAB_0010c2b0;
      puVar1 = &(e->state).interrupt.if_;
      *puVar1 = *puVar1 | 2;
    }
    BVar3 = TRUE;
    goto LAB_0010c2b0;
  }
LAB_0010c1d1:
  if (PVar2 == PPU_MODE_MODE2) {
    BVar3 = (e->state).ppu.stat.mode2.irq;
joined_r0x0010c20f:
    if (BVar3 != FALSE) {
      return;
    }
  }
  else {
    if (PVar2 == PPU_MODE_VBLANK) {
      BVar3 = (e->state).ppu.stat.vblank.irq;
      goto joined_r0x0010c20f;
    }
    if (PVar2 == PPU_MODE_HBLANK) {
      BVar3 = (e->state).ppu.stat.hblank.irq;
      goto joined_r0x0010c20f;
    }
  }
  BVar3 = FALSE;
  if (((e->state).ppu.stat.new_ly_eq_lyc != FALSE) && ((e->state).ppu.stat.y_compare.irq != FALSE))
  {
    return;
  }
LAB_0010c2b0:
  (e->state).ppu.stat.if_ = BVar3;
  return;
}

Assistant:

static void check_stat(Emulator* e) {
  if (!STAT.if_ && SHOULD_TRIGGER_STAT) {
    HOOK(trigger_stat_ii, PPU.ly, TICKS + CPU_TICK);
    INTR.new_if |= IF_STAT;
    if (!(TRIGGER_VBLANK || TRIGGER_Y_COMPARE)) {
      INTR.if_ |= IF_STAT;
    }
    STAT.if_ = TRUE;
  } else if (!(TRIGGER_HBLANK || TRIGGER_VBLANK || CHECK_MODE2 ||
               CHECK_Y_COMPARE)) {
    STAT.if_ = FALSE;
  }
}